

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfindrep.h
# Opt level: O3

void __thiscall
re_replace_arg::set(re_replace_arg *this,vm_val_t *patv,vm_val_t *rplv,int str_to_pat,int32_t flags)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  int iVar3;
  re_status_t rVar4;
  ushort *puVar5;
  char *pcVar6;
  CVmFuncPtr f;
  CVmFuncPtr local_30;
  
  this->flags = flags;
  if ((patv->typ == VM_OBJ) &&
     (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(patv->val).obj >> 0xc]
                                     [(patv->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(patv->val).obj >> 0xc] + ((patv->val).obj & 0xfff),
                         CVmObjPattern::metaclass_reg_), iVar3 != 0)) {
    create_searcher(this);
    this->pat = (re_compiled_pattern *)
                **(undefined8 **)
                  ((long)&G_obj_table_X.pages_[(patv->val).obj >> 0xc][(patv->val).obj & 0xfff].ptr_
                  + 8);
    this->our_pat = 0;
  }
  else {
    puVar5 = (ushort *)vm_val_t::get_as_string(patv);
    if (puVar5 == (ushort *)0x0) goto LAB_0022b012;
    if (str_to_pat == 0) {
      this->pat_str = (char *)puVar5;
    }
    else {
      create_searcher(this);
      rVar4 = CRegexParser::compile_pattern
                        (G_bif_tads_globals_X->rex_parser,(char *)(puVar5 + 1),(ulong)*puVar5,
                         &this->pat);
      if (rVar4 != RE_STATUS_SUCCESS) {
        this->pat = (re_compiled_pattern *)0x0;
      }
      this->our_pat = 1;
    }
  }
  if (rplv->typ == VM_NIL) {
    pcVar6 = "";
  }
  else {
    pcVar6 = vm_val_t::get_as_string(rplv);
    if (pcVar6 == (char *)0x0) {
      iVar3 = vm_val_t::is_func_ptr(rplv);
      if (iVar3 != 0) {
        this->rpl_str = (char *)0x0;
        uVar2 = *(undefined4 *)&rplv->field_0x4;
        aVar1 = rplv->val;
        (this->rpl_func).typ = rplv->typ;
        *(undefined4 *)&(this->rpl_func).field_0x4 = uVar2;
        (this->rpl_func).val = aVar1;
        CVmFuncPtr::set(&local_30,rplv);
        if ((char)*local_30.p_ < '\0') {
          iVar3 = -1;
        }
        else {
          iVar3 = (uint)local_30.p_[1] + (int)(char)*local_30.p_;
        }
        this->rpl_argc = iVar3;
        return;
      }
LAB_0022b012:
      err_throw(0x900);
    }
  }
  this->rpl_str = pcVar6;
  return;
}

Assistant:

void set(VMG_ const vm_val_t *patv, const vm_val_t *rplv,
             int str_to_pat, int32_t flags)
    {
        /* save the flags */
        this->flags = flags;

        /* retrieve the compiled RexPattern or uncompiled pattern string */
        const char *str;
        if (patv->typ == VM_OBJ
            && CVmObjPattern::is_pattern_obj(vmg_ patv->val.obj))
        {
            /* create the searcher, if we haven't already */
            create_searcher(vmg0_);

            /* it's a pattern object - get its compiled pattern structure */
            pat = ((CVmObjPattern *)vm_objp(vmg_ patv->val.obj))
                  ->get_pattern(vmg0_);

            /* we didn't create the pattern object */
            our_pat = FALSE;
        }
        else if ((str = patv->get_as_string(vmg0_)) != 0)
        {
            /* it's a string - decide how to treat it */
            if (str_to_pat)
            {
                /* create the searcher */
                create_searcher(vmg0_);

                /* we treat strings as regular expressions - compile it */
                re_status_t stat;
                stat = G_bif_tads_globals->rex_parser->compile_pattern(
                    str + VMB_LEN, vmb_get_len(str), &pat);

                /* if that failed, we don't have a pattern */
                if (stat != RE_STATUS_SUCCESS)
                    pat = 0;

                /* make a note that we allocated the pattern */
                our_pat = TRUE;
            }
            else
            {
                /* we treat strings as simple literal search strings */
                pat_str = str;
            }
        }
        else
        {
            /* invalid type */
            err_throw(VMERR_BAD_TYPE_BIF);
        }

        /* 
         *   Save the replacement value.  This can be a string, nil (which we
         *   treat like an empty string), or a callback function. 
         */
        if (rplv->typ == VM_NIL)
        {
            /* treat it as an empty string */
            rpl_str = "\000\000";
        }
        else if ((str = rplv->get_as_string(vmg0_)) != 0)
        {
            /* save the string value */
            rpl_str = str;
        }
        else if (rplv->is_func_ptr(vmg0_))
        {
            /* it's a function or invokable object */
            rpl_str = 0;
            rpl_func = *rplv;

            /* get the number of arguments it expects */
            CVmFuncPtr f(vmg_ rplv);
            rpl_argc = f.is_varargs() ? -1 : f.get_max_argc();
        }
        else
        {
            /* invalid type */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
    }